

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::deviceProperties2(TestStatus *__return_storage_ptr__,Context *context)

{
  RefData<vk::VkInstance_s_*> data;
  VkAllocationCallbacks *platformInterface;
  deBool dVar1;
  int iVar2;
  VkInstance_s **ppVVar3;
  size_type sVar4;
  const_reference ppVVar5;
  TestError *pTVar6;
  allocator<char> local_8e9;
  string local_8e8;
  char *local_8c8;
  deUint8 *extPropertyBytes;
  deUint8 *corePropertyBytes;
  size_t size;
  size_t offset;
  undefined1 local_8a0 [4];
  int propNdx;
  VkPhysicalDeviceProperties2KHR extProperties;
  VkPhysicalDeviceProperties coreProperties;
  size_t deviceNdx;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  InstanceDriver vki;
  Move<vk::VkInstance_s_*> local_68;
  RefData<vk::VkInstance_s_*> local_50;
  undefined1 local_38 [8];
  Unique<vk::VkInstance_s_*> instance;
  PlatformInterface *vkp;
  Context *context_local;
  
  instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Context::getPlatformInterface(context);
  createInstanceWithExtension
            (&local_68,
             (PlatformInterface *)
             instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             "VK_KHR_get_physical_device_properties2");
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_50,(Move *)&local_68);
  data.deleter.m_destroyInstance = local_50.deleter.m_destroyInstance;
  data.object = local_50.object;
  data.deleter.m_allocator = local_50.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique((Unique<vk::VkInstance_s_*> *)local_38,data);
  ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_68);
  platformInterface = instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator;
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)local_38);
  ::vk::InstanceDriver::InstanceDriver
            ((InstanceDriver *)
             &devices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (PlatformInterface *)platformInterface,*ppVVar3);
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)local_38);
  ::vk::enumeratePhysicalDevices
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             &deviceNdx,
             (InstanceInterface *)
             &devices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppVVar3);
  coreProperties.sparseProperties.residencyNonResidentStrict = 0;
  coreProperties._820_4_ = 0;
  do {
    sVar4 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::size
                      ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                        *)&deviceNdx);
    if (sVar4 <= (ulong)coreProperties._816_8_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8e8,"Querying device properties succeeded",&local_8e9);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_8e8);
      std::__cxx11::string::~string((string *)&local_8e8);
      std::allocator<char>::~allocator(&local_8e9);
      std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::~vector
                ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
                 &deviceNdx);
      ::vk::InstanceDriver::~InstanceDriver
                ((InstanceDriver *)
                 &devices.
                  super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::vk::refdetails::Unique<vk::VkInstance_s_*>::~Unique((Unique<vk::VkInstance_s_*> *)local_38);
      return __return_storage_ptr__;
    }
    local_8a0 = (undefined1  [4])0x3b9bb079;
    extProperties.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    extProperties._4_4_ = 0;
    ppVVar5 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
              operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          *)&deviceNdx,coreProperties._816_8_);
    ::vk::InstanceDriver::getPhysicalDeviceProperties
              ((InstanceDriver *)
               &devices.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppVVar5,
               (VkPhysicalDeviceProperties *)
               &extProperties.properties.sparseProperties.residencyNonResidentStrict);
    ppVVar5 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
              operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          *)&deviceNdx,coreProperties._816_8_);
    ::vk::InstanceDriver::getPhysicalDeviceProperties2KHR
              ((InstanceDriver *)
               &devices.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppVVar5,
               (VkPhysicalDeviceProperties2KHR *)local_8a0);
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || (local_8a0 != (undefined1  [4])0x3b9bb079)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,
                   "extProperties.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2_KHR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x8cd);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || (extProperties._0_8_ != 0)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,"extProperties.pNext == DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x8ce);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    for (offset._4_4_ = 0; offset._4_4_ < 0x76; offset._4_4_ = offset._4_4_ + 1) {
      size = *(size_t *)
              (api::(anonymous_namespace)::s_physicalDevicePropertiesOffsetTable +
              (long)offset._4_4_ * 0x10);
      corePropertyBytes =
           *(deUint8 **)
            (api::(anonymous_namespace)::s_physicalDevicePropertiesOffsetTable +
            (long)offset._4_4_ * 0x10 + 8);
      extPropertyBytes = (deUint8 *)(coreProperties.deviceName + (size - 0x1c));
      local_8c8 = extProperties.properties.deviceName + (size - 0x1c);
      iVar2 = deMemCmp(extPropertyBytes,local_8c8,(size_t)corePropertyBytes);
      if (iVar2 != 0) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,
                   "Mismatch between properties reported by vkGetPhysicalDeviceProperties and vkGetPhysicalDeviceProperties2KHR"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x8dc);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    coreProperties._816_8_ = coreProperties._816_8_ + 1;
  } while( true );
}

Assistant:

tcu::TestStatus deviceProperties2 (Context& context)
{
	const PlatformInterface&		vkp			= context.getPlatformInterface();
	const Unique<VkInstance>		instance	(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki			(vkp, *instance);
	const vector<VkPhysicalDevice>	devices		= enumeratePhysicalDevices(vki, *instance);

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		VkPhysicalDeviceProperties		coreProperties;
		VkPhysicalDeviceProperties2KHR	extProperties;

		extProperties.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2_KHR;
		extProperties.pNext = DE_NULL;

		vki.getPhysicalDeviceProperties(devices[deviceNdx], &coreProperties);
		vki.getPhysicalDeviceProperties2KHR(devices[deviceNdx], &extProperties);

		TCU_CHECK(extProperties.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2_KHR);
		TCU_CHECK(extProperties.pNext == DE_NULL);

		// We can't use memcmp() here because the structs may contain padding bytes that drivers may or may not
		// have written while writing the data and memcmp will compare them anyway, so we iterate through the
		// valid bytes for each field in the struct and compare only the valid bytes for each one.
		for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(s_physicalDevicePropertiesOffsetTable); propNdx++)
		{
			const size_t offset					= s_physicalDevicePropertiesOffsetTable[propNdx].offset;
			const size_t size					= s_physicalDevicePropertiesOffsetTable[propNdx].size;

			const deUint8* corePropertyBytes	= reinterpret_cast<deUint8*>(&coreProperties) + offset;
			const deUint8* extPropertyBytes		= reinterpret_cast<deUint8*>(&extProperties.properties) + offset;

			if (deMemCmp(corePropertyBytes, extPropertyBytes, size) != 0)
				TCU_FAIL("Mismatch between properties reported by vkGetPhysicalDeviceProperties and vkGetPhysicalDeviceProperties2KHR");
		}
	}

	return tcu::TestStatus::pass("Querying device properties succeeded");
}